

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_on_write.h
# Opt level: O2

int __thiscall
delegating_shared_control_block<BaseType,_DerivedType>::clone
          (delegating_shared_control_block<BaseType,_DerivedType> *this,__fn *__fn,
          void *__child_stack,int __flags,void *__arg,...)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<shared_control_block<DerivedType>_> local_38;
  undefined1 local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  (**(code **)(**(long **)(__fn + 8) + 0x10))(local_28);
  std::
  make_shared<delegating_shared_control_block<BaseType,DerivedType>,std::shared_ptr<shared_control_block<DerivedType>>>
            (&local_38);
  _Var1._M_pi = local_38.
                super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  (this->super_shared_control_block<BaseType>)._vptr_shared_control_block =
       (_func_int **)
       local_38.super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_38.super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->delegate_).
  super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  local_38.super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.
              super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  return (int)this;
}

Assistant:

std::shared_ptr<shared_control_block<T>> clone() const override
  {
    return std::make_shared<delegating_shared_control_block>(delegate_->clone());
  }